

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTestPackages.cpp
# Opt level: O1

int __thiscall gl4cts::GL45TestPackage::init(GL45TestPackage *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  ClipControlTests *this_00;
  TestNode *pTVar1;
  TextureBarrierTests *this_01;
  
  GL44TestPackage::init(&this->super_GL44TestPackage,ctx);
  this_00 = (ClipControlTests *)operator_new(0x80);
  ClipControlTests::ClipControlTests
            (this_00,&(*(PackageContext **)
                        ((long)&(this->super_GL44TestPackage).super_GL43TestPackage.
                                super_GL42TestPackage.super_GL41TestPackage.super_GL40TestPackage.
                                super_GL33TestPackage.super_GL32TestPackage + 0x78))->m_context,
             API_GL_45core);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  pTVar1 = (TestNode *)operator_new(0x78);
  DirectStateAccess::Tests::Tests
            ((Tests *)pTVar1,
             &(*(PackageContext **)
                ((long)&(this->super_GL44TestPackage).super_GL43TestPackage.super_GL42TestPackage.
                        super_GL41TestPackage.super_GL40TestPackage.super_GL33TestPackage.
                        super_GL32TestPackage + 0x78))->m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  GetTextureSubImage::Tests::Tests
            ((Tests *)pTVar1,
             &(*(PackageContext **)
                ((long)&(this->super_GL44TestPackage).super_GL43TestPackage.super_GL42TestPackage.
                        super_GL41TestPackage.super_GL40TestPackage.super_GL33TestPackage.
                        super_GL32TestPackage + 0x78))->m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  RobustnessTests::RobustnessTests
            ((RobustnessTests *)pTVar1,
             &(*(PackageContext **)
                ((long)&(this->super_GL44TestPackage).super_GL43TestPackage.super_GL42TestPackage.
                        super_GL41TestPackage.super_GL40TestPackage.super_GL33TestPackage.
                        super_GL32TestPackage + 0x78))->m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  this_01 = (TextureBarrierTests *)operator_new(0x80);
  TextureBarrierTests::TextureBarrierTests
            (this_01,&(*(PackageContext **)
                        ((long)&(this->super_GL44TestPackage).super_GL43TestPackage.
                                super_GL42TestPackage.super_GL41TestPackage.super_GL40TestPackage.
                                super_GL33TestPackage.super_GL32TestPackage + 0x78))->m_context,
             API_GL_45core);
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_01);
  pTVar1 = (TestNode *)operator_new(0x78);
  ConditionalRenderInverted::Tests::Tests
            ((Tests *)pTVar1,
             &(*(PackageContext **)
                ((long)&(this->super_GL44TestPackage).super_GL43TestPackage.super_GL42TestPackage.
                        super_GL41TestPackage.super_GL40TestPackage.super_GL33TestPackage.
                        super_GL32TestPackage + 0x78))->m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  Sync::Tests::Tests((Tests *)pTVar1,
                     &(*(PackageContext **)
                        ((long)&(this->super_GL44TestPackage).super_GL43TestPackage.
                                super_GL42TestPackage.super_GL41TestPackage.super_GL40TestPackage.
                                super_GL33TestPackage.super_GL32TestPackage + 0x78))->m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  IncompleteTextureAccess::Tests::Tests
            ((Tests *)pTVar1,
             &(*(PackageContext **)
                ((long)&(this->super_GL44TestPackage).super_GL43TestPackage.super_GL42TestPackage.
                        super_GL41TestPackage.super_GL40TestPackage.super_GL33TestPackage.
                        super_GL32TestPackage + 0x78))->m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  ParallelShaderCompileTests::ParallelShaderCompileTests
            ((ParallelShaderCompileTests *)pTVar1,
             &(*(PackageContext **)
                ((long)&(this->super_GL44TestPackage).super_GL43TestPackage.super_GL42TestPackage.
                        super_GL41TestPackage.super_GL40TestPackage.super_GL33TestPackage.
                        super_GL32TestPackage + 0x78))->m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  PostDepthCoverage::PostDepthCoverage
            ((PostDepthCoverage *)pTVar1,
             &(*(PackageContext **)
                ((long)&(this->super_GL44TestPackage).super_GL43TestPackage.super_GL42TestPackage.
                        super_GL41TestPackage.super_GL40TestPackage.super_GL33TestPackage.
                        super_GL32TestPackage + 0x78))->m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  SparseTexture2Tests::SparseTexture2Tests
            ((SparseTexture2Tests *)pTVar1,
             &(*(PackageContext **)
                ((long)&(this->super_GL44TestPackage).super_GL43TestPackage.super_GL42TestPackage.
                        super_GL41TestPackage.super_GL40TestPackage.super_GL33TestPackage.
                        super_GL32TestPackage + 0x78))->m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  SparseTextureClampTests::SparseTextureClampTests
            ((SparseTextureClampTests *)pTVar1,
             &(*(PackageContext **)
                ((long)&(this->super_GL44TestPackage).super_GL43TestPackage.super_GL42TestPackage.
                        super_GL41TestPackage.super_GL40TestPackage.super_GL33TestPackage.
                        super_GL32TestPackage + 0x78))->m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  pTVar1 = (TestNode *)operator_new(0x78);
  TextureFilterMinmax::TextureFilterMinmax
            ((TextureFilterMinmax *)pTVar1,
             &(*(PackageContext **)
                ((long)&(this->super_GL44TestPackage).super_GL43TestPackage.super_GL42TestPackage.
                        super_GL41TestPackage.super_GL40TestPackage.super_GL33TestPackage.
                        super_GL32TestPackage + 0x78))->m_context);
  tcu::TestNode::addChild((TestNode *)this,pTVar1);
  return extraout_EAX;
}

Assistant:

void GL45TestPackage::init(void)
{
	// Call init() in parent - this creates context.
	GL44TestPackage::init();

	try
	{
		addChild(new gl4cts::ClipControlTests(getContext(), gl4cts::ClipControlTests::API_GL_45core));
		addChild(new gl4cts::DirectStateAccess::Tests(getContext()));
		addChild(new gl4cts::GetTextureSubImage::Tests(getContext()));
		addChild(new gl4cts::RobustnessTests(getContext()));
		addChild(new gl4cts::TextureBarrierTests(getContext(), gl4cts::TextureBarrierTests::API_GL_45core));
		addChild(new gl4cts::ConditionalRenderInverted::Tests(getContext()));
		addChild(new gl4cts::Sync::Tests(getContext()));
		addChild(new gl4cts::IncompleteTextureAccess::Tests(getContext()));
		addChild(new gl4cts::ParallelShaderCompileTests(getContext()));
		addChild(new gl4cts::PostDepthCoverage(getContext()));
		addChild(new gl4cts::SparseTexture2Tests(getContext()));
		addChild(new gl4cts::SparseTextureClampTests(getContext()));
		addChild(new gl4cts::TextureFilterMinmax(getContext()));
	}
	catch (...)
	{
		// Destroy context.
		TestPackage::deinit();
		throw;
	}
}